

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::GetTargetSets
          (cmGlobalGenerator *this,TargetDependSet *projectTargets,TargetDependSet *originalTargets,
          cmLocalGenerator *root,GeneratorVector *generators)

{
  bool bVar1;
  int iVar2;
  pointer ppcVar3;
  _Hash_node_base *p_Var4;
  cmTargetDepend local_40;
  
  ppcVar3 = (generators->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar3 !=
      (generators->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      bVar1 = IsExcluded(this,root,*ppcVar3);
      if (!bVar1) {
        for (p_Var4 = ((*ppcVar3)->Makefile->Targets)._M_h._M_before_begin._M_nxt;
            p_Var4 != (_Hash_node_base *)0x0; p_Var4 = p_Var4->_M_nxt) {
          if (*(int *)&p_Var4[0x61]._M_nxt == 6) {
LAB_0032520f:
            if ((cmMakefile *)p_Var4[0x5f]._M_nxt == root->Makefile) goto LAB_0032521c;
          }
          else {
            (*this->_vptr_cmGlobalGenerator[0xf])(this);
            iVar2 = std::__cxx11::string::compare((char *)(p_Var4 + 0x3a));
            if (iVar2 == 0) goto LAB_0032520f;
LAB_0032521c:
            local_40.Link = false;
            local_40.Util = false;
            local_40.Target = (cmTarget *)(p_Var4 + 5);
            std::
            _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
            ::_M_insert_unique<cmTargetDepend>
                      ((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                        *)originalTargets,&local_40);
            AddTargetDepends(this,(cmTarget *)(p_Var4 + 5),projectTargets);
          }
        }
      }
      ppcVar3 = ppcVar3 + 1;
    } while (ppcVar3 !=
             (generators->
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmGlobalGenerator::GetTargetSets(TargetDependSet& projectTargets,
                                      TargetDependSet& originalTargets,
                                      cmLocalGenerator* root,
                                      GeneratorVector const& generators)
{
  // loop over all local generators
  for(std::vector<cmLocalGenerator*>::const_iterator i = generators.begin();
      i != generators.end(); ++i)
    {
    // check to make sure generator is not excluded
    if(this->IsExcluded(root, *i))
      {
      continue;
      }
    cmMakefile* mf = (*i)->GetMakefile();
    // Get the targets in the makefile
    cmTargets &tgts = mf->GetTargets();
    // loop over all the targets
    for (cmTargets::iterator l = tgts.begin(); l != tgts.end(); ++l)
      {
      cmTarget* target = &l->second;
      if(this->IsRootOnlyTarget(target) &&
         target->GetMakefile() != root->GetMakefile())
        {
        continue;
        }
      // put the target in the set of original targets
      originalTargets.insert(target);
      // Get the set of targets that depend on target
      this->AddTargetDepends(target, projectTargets);
      }
    }
}